

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.h
# Opt level: O0

bool __thiscall Memory::Recycler::HasPendingMarkObjects(Recycler *this)

{
  bool bVar1;
  bool local_11;
  Recycler *this_local;
  
  bVar1 = MarkContext::HasPendingMarkObjects(&this->markContext);
  local_11 = true;
  if (!bVar1) {
    bVar1 = MarkContext::HasPendingMarkObjects(&this->parallelMarkContext1);
    local_11 = true;
    if (!bVar1) {
      bVar1 = MarkContext::HasPendingMarkObjects(&this->parallelMarkContext2);
      local_11 = true;
      if (!bVar1) {
        local_11 = MarkContext::HasPendingMarkObjects(&this->parallelMarkContext3);
      }
    }
  }
  return local_11;
}

Assistant:

bool HasPendingMarkObjects() const { return markContext.HasPendingMarkObjects() || parallelMarkContext1.HasPendingMarkObjects() || parallelMarkContext2.HasPendingMarkObjects() || parallelMarkContext3.HasPendingMarkObjects(); }